

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int check_type_union_leafref(lys_type *type)

{
  uint uVar1;
  lys_type_bit *plVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  
  if ((type->base == LY_TYPE_UNION) && (uVar1 = (type->info).bits.count, uVar1 != 0)) {
    uVar5 = 0;
    for (bVar4 = 0; bVar4 < uVar1; bVar4 = bVar4 + 1) {
      plVar2 = (type->info).bits.bit;
      iVar3 = *(int *)((long)plVar2 + (ulong)bVar4 * 0x40);
      if (iVar3 == 0xb) {
        iVar3 = check_type_union_leafref((lys_type *)((long)plVar2 + (ulong)bVar4 * 0x40));
        if (iVar3 != 0) {
          return 1;
        }
      }
      else if (iVar3 == 9) {
        return 1;
      }
    }
  }
  else {
    uVar5 = (uint)type->der->has_union_leafref;
  }
  return uVar5;
}

Assistant:

static int
check_type_union_leafref(struct lys_type *type)
{
    uint8_t i;

    if ((type->base == LY_TYPE_UNION) && type->info.uni.count) {
        /* go through unions and look for leafref */
        for (i = 0; i < type->info.uni.count; ++i) {
            switch (type->info.uni.types[i].base) {
            case LY_TYPE_LEAFREF:
                return 1;
            case LY_TYPE_UNION:
                if (check_type_union_leafref(&type->info.uni.types[i])) {
                    return 1;
                }
                break;
            default:
                break;
            }
        }

        return 0;
    }

    /* just inherit the flag value */
    return type->der->has_union_leafref;
}